

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

float glu::TextureTestUtil::computeCubeLodFromDerivates
                (LodMode lodMode,Vec3 *coord,Vec3 *coordDx,Vec3 *coordDy,int faceSize)

{
  CubeFace CVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  CVar1 = tcu::selectCubeFace(coord);
  if (CVar1 < CUBEFACE_LAST) {
    uVar4 = (ulong)CVar1;
    lVar2 = *(long *)(&DAT_019086d8 + uVar4 * 8);
    lVar3 = *(long *)(&DAT_01908708 + uVar4 * 8);
    lVar5 = *(long *)(&DAT_01908738 + uVar4 * 8);
  }
  else {
    lVar2 = 0;
    lVar3 = 0;
    lVar5 = 0;
  }
  fVar9 = coord->m_data[lVar5];
  fVar7 = -fVar9;
  if (-fVar9 <= fVar9) {
    fVar7 = fVar9;
  }
  fVar9 = coordDx->m_data[lVar5];
  fVar6 = -fVar9;
  if (-fVar9 <= fVar9) {
    fVar6 = fVar9;
  }
  fVar9 = coordDy->m_data[lVar5];
  fVar8 = -fVar9;
  if (-fVar9 <= fVar9) {
    fVar8 = fVar9;
  }
  fVar9 = (float)faceSize * 0.5;
  fVar10 = fVar7 * fVar7;
  fVar9 = computeLodFromDerivates
                    (lodMode,((coordDx->m_data[lVar3] * fVar7 - fVar6 * coord->m_data[lVar3]) *
                             fVar9) / fVar10,
                     ((coordDx->m_data[lVar2] * fVar7 - fVar6 * coord->m_data[lVar2]) * fVar9) /
                     fVar10,((coordDy->m_data[lVar3] * fVar7 - coord->m_data[lVar3] * fVar8) * fVar9
                            ) / fVar10,
                     ((fVar7 * coordDy->m_data[lVar2] - fVar8 * coord->m_data[lVar2]) * fVar9) /
                     fVar10);
  return fVar9;
}

Assistant:

static float computeCubeLodFromDerivates (LodMode lodMode, const tcu::Vec3& coord, const tcu::Vec3& coordDx, const tcu::Vec3& coordDy, const int faceSize)
{
	const tcu::CubeFace	face	= tcu::selectCubeFace(coord);
	int					maNdx	= 0;
	int					sNdx	= 0;
	int					tNdx	= 0;

	// \note Derivate signs don't matter when computing lod
	switch (face)
	{
		case tcu::CUBEFACE_NEGATIVE_X:
		case tcu::CUBEFACE_POSITIVE_X: maNdx = 0; sNdx = 2; tNdx = 1; break;
		case tcu::CUBEFACE_NEGATIVE_Y:
		case tcu::CUBEFACE_POSITIVE_Y: maNdx = 1; sNdx = 0; tNdx = 2; break;
		case tcu::CUBEFACE_NEGATIVE_Z:
		case tcu::CUBEFACE_POSITIVE_Z: maNdx = 2; sNdx = 0; tNdx = 1; break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	{
		const float		sc		= coord[sNdx];
		const float		tc		= coord[tNdx];
		const float		ma		= de::abs(coord[maNdx]);
		const float		scdx	= coordDx[sNdx];
		const float		tcdx	= coordDx[tNdx];
		const float		madx	= de::abs(coordDx[maNdx]);
		const float		scdy	= coordDy[sNdx];
		const float		tcdy	= coordDy[tNdx];
		const float		mady	= de::abs(coordDy[maNdx]);
		const float		dudx	= float(faceSize) * 0.5f * (scdx*ma - sc*madx) / (ma*ma);
		const float		dvdx	= float(faceSize) * 0.5f * (tcdx*ma - tc*madx) / (ma*ma);
		const float		dudy	= float(faceSize) * 0.5f * (scdy*ma - sc*mady) / (ma*ma);
		const float		dvdy	= float(faceSize) * 0.5f * (tcdy*ma - tc*mady) / (ma*ma);

		return computeLodFromDerivates(lodMode, dudx, dvdx, dudy, dvdy);
	}
}